

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O3

void __thiscall
chrono::ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>::ChEnumMapper
          (ChEnumMapper<chrono::ChShaftsMotor::eCh_shaftsmotor_mode> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>
  *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  (this->super_ChEnumMapperBase)._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b23638;
  this->value_ptr = (eCh_shaftsmotor_mode *)0x0;
  (this->enummap).
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->enummap).
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __p = (vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>
         *)::operator_new(0x18);
  (__p->
  super__Vector_base<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->
  super__Vector_base<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->
  super__Vector_base<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>>>*>
            (a_Stack_20,__p);
  _Var1._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->enummap).
            super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->enummap).
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = __p;
  (this->enummap).
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChShaftsMotor::eCh_shaftsmotor_mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
    }
  }
  return;
}

Assistant:

ChEnumMapper() : value_ptr(0) {
        enummap = std::shared_ptr<std::vector<ChEnumNamePair<Te> > >(new std::vector<ChEnumNamePair<Te> >);
    }